

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedData(CFIReaderImpl *this,size_t index,size_t len)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  iterator iVar5;
  runtime_error *prVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<const_Assimp::FIValue> sVar8;
  string uri;
  string local_70;
  key_type local_50;
  
  if (len < 0x20) {
    puVar1 = *(undefined8 **)(defaultDecoder + len * 8);
    if (puVar1 == (undefined8 *)0x0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_70,len);
      std::operator+(&local_50,"Invalid encoding algorithm index ",&local_70);
      std::runtime_error::runtime_error(prVar6,(string *)&local_50);
      *(undefined ***)prVar6 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)*puVar1)(this,puVar1,*(undefined8 *)(index + 0x10));
    _Var7._M_pi = extraout_RDX;
  }
  else {
    lVar2 = *(long *)(index + 0x40);
    if ((ulong)(*(long *)(index + 0x48) - lVar2 >> 5) <= len - 0x20) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_70,len);
      std::operator+(&local_50,"Invalid encoding algorithm index ",&local_70);
      std::runtime_error::runtime_error(prVar6,(string *)&local_50);
      *(undefined ***)prVar6 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar4 = (len - 0x20) * 0x20;
    lVar3 = *(long *)(lVar2 + lVar4);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar3,*(long *)(lVar2 + 8 + lVar4) + lVar3);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
                    *)(index + 0x1d0),&local_50);
    if (iVar5._M_node == (_Base_ptr)(index + 0x1d8)) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_70,"Unsupported encoding algorithm ",&local_50);
      std::runtime_error::runtime_error(prVar6,(string *)&local_70);
      *(undefined ***)prVar6 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)**(undefined8 **)(iVar5._M_node + 2))
              (this,*(undefined8 **)(iVar5._M_node + 2),*(undefined8 *)(index + 0x10));
    _Var7._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  sVar8.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar8.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedData(size_t index, size_t len) {
        if (index < 32) {
            FIDecoder *decoder = defaultDecoder[index];
            if (!decoder) {
                throw DeadlyImportError("Invalid encoding algorithm index " + to_string(index));
            }
            return decoder->decode(dataP, len);
        }
        else {
            if (index - 32 >= vocabulary.encodingAlgorithmTable.size()) {
                throw DeadlyImportError("Invalid encoding algorithm index " + to_string(index));
            }
            std::string uri = vocabulary.encodingAlgorithmTable[index - 32];
            auto it = decoderMap.find(uri);
            if (it == decoderMap.end()) {
                throw DeadlyImportError("Unsupported encoding algorithm " + uri);
            }
            else {
                return it->second->decode(dataP, len);
            }
        }
    }